

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

bool __thiscall ON_LineCurve::IsValid(ON_LineCurve *this,ON_TextLog *text_log)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = ON_Interval::operator[](&this->m_t,0);
  dVar4 = ON_Interval::operator[](&this->m_t,1);
  if ((text_log != (ON_TextLog *)0x0) && (dVar4 < dVar3)) {
    ON_TextLog::Print(text_log,L"Line domain not valid.");
  }
  bVar2 = ON_3dPoint::IsCoincident(&(this->m_line).from,&(this->m_line).to);
  bVar1 = bVar2;
  if (text_log != (ON_TextLog *)0x0 && bVar1) {
    ON_TextLog::Print(text_log,L"Line points are coincident.");
  }
  return (text_log == (ON_TextLog *)0x0 || !bVar1) && (dVar3 <= dVar4 && !bVar2);
}

Assistant:

bool ON_LineCurve::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;
  if (m_t[0] > m_t[1])
  {
    if (text_log) text_log->Print(L"Line domain not valid.");
    rc = false;
  }
  if (m_line.from.IsCoincident(m_line.to))
  {
    if (text_log) text_log->Print(L"Line points are coincident.");
    rc = false;
  }
  return rc;
}